

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O3

SUNErrCode SUNNonlinSolInitialize_FixedPoint(SUNNonlinearSolver NLS)

{
  void *pvVar1;
  
  pvVar1 = NLS->content;
  *(undefined8 *)((long)pvVar1 + 0x98) = 0;
  *(undefined8 *)((long)pvVar1 + 0xa0) = 0;
  return 0;
}

Assistant:

SUNErrCode SUNNonlinSolInitialize_FixedPoint(SUNNonlinearSolver NLS)
{
  SUNFunctionBegin(NLS->sunctx);
  /* check that all required function pointers have been set */
  SUNAssert(FP_CONTENT(NLS)->Sys && FP_CONTENT(NLS)->CTest, SUN_ERR_ARG_CORRUPT);

  /* reset the total number of iterations and convergence failures */
  FP_CONTENT(NLS)->niters     = 0;
  FP_CONTENT(NLS)->nconvfails = 0;

  return SUN_SUCCESS;
}